

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::AppendToList
          (ExtensionSet *this,Descriptor *containing_type,DescriptorPool *pool,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *output)

{
  pointer *pppFVar1;
  iterator __position;
  byte bVar2;
  int iVar3;
  FieldDescriptor *in_RAX;
  _Rb_tree_node_base *p_Var4;
  FieldDescriptor *local_38;
  
  local_38 = in_RAX;
  for (p_Var4 = (this->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    if (*(char *)((long)&p_Var4[1]._M_left + 1) == '\x01') {
      iVar3 = Extension::GetSize((Extension *)&p_Var4[1]._M_parent);
      bVar2 = 0 < iVar3;
    }
    else {
      bVar2 = *(byte *)((long)&p_Var4[1]._M_left + 2) ^ 1;
    }
    if ((bVar2 & 1) != 0) {
      if (p_Var4[1]._M_right == (_Base_ptr)0x0) {
        local_38 = DescriptorPool::FindExtensionByNumber(pool,containing_type,p_Var4[1]._M_color);
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::emplace_back<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)output,&local_38);
      }
      else {
        __position._M_current =
             (output->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (output->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)output,__position,(FieldDescriptor **)&p_Var4[1]._M_right);
        }
        else {
          *__position._M_current = (FieldDescriptor *)p_Var4[1]._M_right;
          pppFVar1 = &(output->
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::AppendToList(const Descriptor* containing_type,
                                const DescriptorPool* pool,
                                vector<const FieldDescriptor*>* output) const {
  for (map<int, Extension>::const_iterator iter = extensions_.begin();
       iter != extensions_.end(); ++iter) {
    bool has = false;
    if (iter->second.is_repeated) {
      has = iter->second.GetSize() > 0;
    } else {
      has = !iter->second.is_cleared;
    }

    if (has) {
      // TODO(kenton): Looking up each field by number is somewhat unfortunate.
      //   Is there a better way?  The problem is that descriptors are lazily-
      //   initialized, so they might not even be constructed until
      //   AppendToList() is called.

      if (iter->second.descriptor == NULL) {
        output->push_back(pool->FindExtensionByNumber(
            containing_type, iter->first));
      } else {
        output->push_back(iter->second.descriptor);
      }
    }
  }
}